

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  int local_1c;
  int count_local;
  int mask_local;
  lua_Hook func_local;
  lua_State *L_local;
  
  if ((func == (lua_Hook)0x0) || (local_1c = mask, _count_local = func, mask == 0)) {
    local_1c = 0;
    _count_local = (lua_Hook)0x0;
  }
  L->hook = _count_local;
  L->basehookcount = count;
  L->hookcount = L->basehookcount;
  L->hookmask = (lu_byte)local_1c;
  return 1;
}

Assistant:

LUA_API int lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
  return 1;
}